

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.h
# Opt level: O3

void __thiscall dh::trivalitem::trivalitem(trivalitem *this)

{
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)this,0,(char *)0x0,0x12a3e9);
  this->type = -100;
  return;
}

Assistant:

trivalitem()
	{
		this->name = "";
		this->type = -100;
	}